

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask.c
# Opt level: O1

void aom_highbd_blend_a64_vmask_c
               (uint8_t *dst_8,uint32_t dst_stride,uint8_t *src0_8,uint32_t src0_stride,
               uint8_t *src1_8,uint32_t src1_stride,uint8_t *mask,int w,int h,int bd)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  if (0 < h) {
    uVar8 = 0;
    uVar6 = 0;
    uVar5 = 0;
    uVar7 = 0;
    do {
      if (0 < w) {
        bVar1 = mask[uVar7];
        uVar3 = (ulong)(uint)w;
        uVar2 = uVar8;
        uVar4 = uVar6;
        uVar9 = uVar5;
        do {
          *(short *)((long)dst_8 * 2 + (ulong)uVar9 * 2) =
               (short)((uint)*(ushort *)((long)src0_8 * 2 + (ulong)uVar2 * 2) * (uint)bVar1 +
                       (uint)*(ushort *)((long)src1_8 * 2 + (ulong)uVar4 * 2) * (0x40 - (uint)bVar1)
                       + 0x20 >> 6);
          uVar9 = uVar9 + 1;
          uVar4 = uVar4 + 1;
          uVar2 = uVar2 + 1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      uVar7 = uVar7 + 1;
      uVar5 = uVar5 + dst_stride;
      uVar6 = uVar6 + src1_stride;
      uVar8 = uVar8 + src0_stride;
    } while (uVar7 != (uint)h);
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_vmask_c(uint8_t *dst_8, uint32_t dst_stride,
                                  const uint8_t *src0_8, uint32_t src0_stride,
                                  const uint8_t *src1_8, uint32_t src1_stride,
                                  const uint8_t *mask, int w, int h, int bd) {
  int i, j;
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst_8);
  const uint16_t *src0 = CONVERT_TO_SHORTPTR(src0_8);
  const uint16_t *src1 = CONVERT_TO_SHORTPTR(src1_8);
  (void)bd;

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  assert(bd == 8 || bd == 10 || bd == 12);

  for (i = 0; i < h; ++i) {
    const int m = mask[i];
    for (j = 0; j < w; ++j) {
      dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                              src1[i * src1_stride + j]);
    }
  }
}